

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O3

void __thiscall CGameControllerCTF::Tick(CGameControllerCTF *this)

{
  int *piVar1;
  uint uVar2;
  CGameContext *pCVar3;
  CFlag *this_00;
  CCharacter *pCVar4;
  CFlag *pCVar5;
  CPlayer *pCVar6;
  IServer *pIVar7;
  IConsole *pIVar8;
  CEntity *pCVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  float fVar16;
  float fVar17;
  char aBuf_1 [256];
  char aBuf [64];
  char local_338 [256];
  CEntity *local_238 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  IGameController::Tick(&this->super_IGameController);
  pCVar3 = (this->super_IGameController).m_pGameServer;
  if (((pCVar3->m_World).m_ResetRequested == false) && ((pCVar3->m_World).m_Paused == false)) {
    uVar15 = 0;
    bVar10 = true;
    do {
      bVar13 = bVar10;
      this_00 = this->m_apFlags[uVar15];
      if (this_00 != (CFlag *)0x0) {
        pCVar4 = this_00->m_pCarrier;
        if (pCVar4 == (CCharacter *)0x0) {
          uVar12 = CGameWorld::FindEntities
                             (&((this->super_IGameController).m_pGameServer)->m_World,
                              (this_00->super_CEntity).m_Pos,14.0,local_238,0x40,3);
          if (0 < (int)uVar12) {
            uVar14 = 0;
            do {
              pCVar9 = local_238[uVar14];
              if (((*(char *)&pCVar9[1].m_pGameWorld == '\x01') &&
                  (*(int *)(pCVar9[1]._vptr_CEntity + 0x81) != -1)) &&
                 (iVar11 = CCollision::IntersectLine
                                     (&((this->super_IGameController).m_pGameServer)->m_Collision,
                                      (this_00->super_CEntity).m_Pos,pCVar9->m_Pos,(vec2 *)0x0,
                                      (vec2 *)0x0), iVar11 == 0)) {
                pCVar4 = (CCharacter *)local_238[uVar14];
                pCVar6 = pCVar4->m_pPlayer;
                if (pCVar6->m_Team != this_00->m_Team) {
                  if (this_00->m_AtStand != false) {
                    piVar1 = (this->super_IGameController).m_aTeamscore + (uVar15 ^ 1);
                    *piVar1 = *piVar1 + 1;
                  }
                  CFlag::Grab(this_00,pCVar4);
                  pCVar6 = this_00->m_pCarrier->m_pPlayer;
                  piVar1 = &pCVar6->m_Score;
                  *piVar1 = *piVar1 + 1;
                  uVar12 = pCVar6->m_ClientID;
                  pIVar7 = (this->super_IGameController).m_pServer;
                  iVar11 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar12);
                  str_format(local_338,0x100,"flag_grab player=\'%d:%s\' team=%d",(ulong)uVar12,
                             CONCAT44(extraout_var_01,iVar11),
                             (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
                  pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                  (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_338,0);
                  CGameContext::SendGameMsg
                            ((this->super_IGameController).m_pGameServer,8,(int)uVar15,-1);
                  break;
                }
                if (this_00->m_AtStand == false) {
                  pCVar6->m_Score = pCVar6->m_Score + 1;
                  uVar2 = pCVar6->m_ClientID;
                  pIVar7 = (this->super_IGameController).m_pServer;
                  iVar11 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar2);
                  str_format(local_338,0x100,"flag_return player=\'%d:%s\' team=%d",(ulong)uVar2,
                             CONCAT44(extraout_var_00,iVar11),(ulong)(uint)pCVar4->m_pPlayer->m_Team
                            );
                  pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                  (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_338,0);
                  CGameContext::SendGameMsg((this->super_IGameController).m_pGameServer,5,-1);
                  (*(this_00->super_CEntity)._vptr_CEntity[3])(this_00);
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
          }
        }
        else {
          pCVar5 = this->m_apFlags[uVar15 ^ 1];
          if (((pCVar5 != (CFlag *)0x0) && (pCVar5->m_AtStand == true)) &&
             (fVar16 = (this_00->super_CEntity).m_Pos.field_0.x -
                       (pCVar5->super_CEntity).m_Pos.field_0.x,
             fVar17 = (this_00->super_CEntity).m_Pos.field_1.y -
                      (pCVar5->super_CEntity).m_Pos.field_1.y,
             SQRT(fVar16 * fVar16 + fVar17 * fVar17) < 42.0)) {
            piVar1 = (this->super_IGameController).m_aTeamscore + (uVar15 ^ 1);
            *piVar1 = *piVar1 + 100;
            pCVar6 = pCVar4->m_pPlayer;
            piVar1 = &pCVar6->m_Score;
            *piVar1 = *piVar1 + 5;
            pIVar7 = (this->super_IGameController).m_pServer;
            fVar16 = (float)(pIVar7->m_CurrentGameTick - this_00->m_GrabTick);
            uVar12 = pCVar6->m_ClientID;
            iVar11 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar12);
            str_format((char *)local_238,0x40,"flag_capture player=\'%d:%s\' team=%d time=%.2f",
                       (double)(fVar16 / (float)((this->super_IGameController).m_pServer)->
                                                m_TickSpeed),(ulong)uVar12,
                       CONCAT44(extraout_var,iVar11),
                       (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
            pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",local_238,0);
            CGameContext::SendGameMsg
                      ((this->super_IGameController).m_pGameServer,9,(int)uVar15,
                       this_00->m_pCarrier->m_pPlayer->m_ClientID,(int)fVar16,-1);
            (*(this->m_apFlags[0]->super_CEntity)._vptr_CEntity[3])();
            (*(this->m_apFlags[1]->super_CEntity)._vptr_CEntity[3])();
            iVar11 = (*(this->super_IGameController)._vptr_IGameController[1])(this);
            if ((char)iVar11 != '\0') goto LAB_0012157a;
          }
        }
      }
      uVar15 = 1;
      bVar10 = false;
    } while (bVar13);
    (*(this->super_IGameController)._vptr_IGameController[1])(this);
  }
LAB_0012157a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameControllerCTF::Tick()
{
	IGameController::Tick();

	if(GameServer()->m_World.m_ResetRequested || GameServer()->m_World.m_Paused)
		return;

	for(int fi = 0; fi < 2; fi++)
	{
		CFlag *F = m_apFlags[fi];

		if(!F)
			continue;

		//
		if(F->GetCarrier())
		{
			if(m_apFlags[fi^1] && m_apFlags[fi^1]->IsAtStand())
			{
				if(distance(F->GetPos(), m_apFlags[fi^1]->GetPos()) < CFlag::ms_PhysSize + CCharacter::ms_PhysSize)
				{
					// CAPTURE! \o/
					m_aTeamscore[fi^1] += 100;
					F->GetCarrier()->GetPlayer()->m_Score += 5;
					float Diff = Server()->Tick() - F->GetGrabTick();

					char aBuf[64];
					str_format(aBuf, sizeof(aBuf), "flag_capture player='%d:%s' team=%d time=%.2f",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam(),
						Diff / (float)Server()->TickSpeed()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);

					GameServer()->SendGameMsg(GAMEMSG_CTF_CAPTURE, fi, F->GetCarrier()->GetPlayer()->GetCID(), Diff, -1);
					for(int i = 0; i < 2; i++)
						m_apFlags[i]->Reset();
					// do a win check(capture could trigger win condition)
					if(DoWincheckMatch())
						return;
				}
			}
		}
		else
		{
			CCharacter *apCloseCCharacters[MAX_CLIENTS];
			int Num = GameServer()->m_World.FindEntities(F->GetPos(), CFlag::ms_PhysSize, (CEntity**)apCloseCCharacters, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
			for(int i = 0; i < Num; i++)
			{
				if(!apCloseCCharacters[i]->IsAlive() || apCloseCCharacters[i]->GetPlayer()->GetTeam() == TEAM_SPECTATORS || GameServer()->Collision()->IntersectLine(F->GetPos(), apCloseCCharacters[i]->GetPos(), NULL, NULL))
					continue;

				if(apCloseCCharacters[i]->GetPlayer()->GetTeam() == F->GetTeam())
				{
					// return the flag
					if(!F->IsAtStand())
					{
						CCharacter *pChr = apCloseCCharacters[i];
						pChr->GetPlayer()->m_Score += 1;

						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "flag_return player='%d:%s' team=%d",
							pChr->GetPlayer()->GetCID(),
							Server()->ClientName(pChr->GetPlayer()->GetCID()),
							pChr->GetPlayer()->GetTeam()
						);
						GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
						GameServer()->SendGameMsg(GAMEMSG_CTF_RETURN, -1);
						F->Reset();
					}
				}
				else
				{
					// take the flag
					if(F->IsAtStand())
						m_aTeamscore[fi^1]++;

					F->Grab(apCloseCCharacters[i]);

					F->GetCarrier()->GetPlayer()->m_Score += 1;

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "flag_grab player='%d:%s' team=%d",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
					GameServer()->SendGameMsg(GAMEMSG_CTF_GRAB, fi, -1);
					break;
				}
			}
		}
	}
	// do a win check(grabbing flags could trigger win condition)
	DoWincheckMatch();
}